

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O2

DataFlowState * __thiscall
slang::analysis::DataFlowAnalysis::copyState
          (DataFlowState *__return_storage_ptr__,DataFlowAnalysis *this,DataFlowState *source)

{
  int in_ECX;
  size_t i;
  ulong uVar1;
  void *in_R8;
  long lVar2;
  IntervalMap<unsigned_long,_std::monostate,_3U> local_70;
  
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_ =
       (pointer)(__return_storage_ptr__->assigned).
                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.
                firstElement;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len = 0;
  (__return_storage_ptr__->assigned).
  super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.cap = 2;
  __return_storage_ptr__->reachable = source->reachable;
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::reserve
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)
             __return_storage_ptr__,
             (source->assigned).
             super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len);
  lVar2 = 0;
  for (uVar1 = 0;
      uVar1 < (source->assigned).
              super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.len;
      uVar1 = uVar1 + 1) {
    IntervalMap<unsigned_long,_std::monostate,_3U>::clone
              (&local_70,
               (__fn *)((long)&((source->assigned).
                                super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                               .data_)->field_0 + lVar2),&this->bitMapAllocator,in_ECX,in_R8);
    SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>>::
    emplace_back<slang::IntervalMap<unsigned_long,std::monostate,3u>>
              ((SmallVectorBase<slang::IntervalMap<unsigned_long,std::monostate,3u>> *)
               __return_storage_ptr__,&local_70);
    lVar2 = lVar2 + 0x40;
  }
  return __return_storage_ptr__;
}

Assistant:

DataFlowState DataFlowAnalysis::copyState(const DataFlowState& source) {
    DataFlowState result;
    result.reachable = source.reachable;
    result.assigned.reserve(source.assigned.size());
    for (size_t i = 0; i < source.assigned.size(); i++)
        result.assigned.emplace_back(source.assigned[i].clone(bitMapAllocator));
    return result;
}